

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_wrap.hpp
# Opt level: O3

string * __thiscall
chaiscript::json_wrap::to_json_abi_cxx11_
          (string *__return_storage_ptr__,json_wrap *this,Boxed_Value *t_bv)

{
  string local_58;
  _Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
  local_38;
  
  to_json_object((JSON *)&local_38,(Boxed_Value *)this);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"  ","");
  json::JSON::dump(__return_storage_ptr__,(JSON *)&local_38,1,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
  ::~_Variant_storage(&local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string to_json(const Boxed_Value &t_bv) { return to_json_object(t_bv).dump(); }